

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O2

bool __thiscall re2::Backtracker::Visit(Backtracker *this,int id,char *p)

{
  uint uVar1;
  Inst *pIVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  LogMessageFatal local_1b0;
  
  pcVar6 = (this->text_).ptr_;
  iVar4 = (this->text_).length_;
  if (pcVar6 + iVar4 < p) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0x9c);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: p <= text_.end()");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
    iVar4 = (this->text_).length_;
    pcVar6 = (this->text_).ptr_;
  }
  pcVar6 = p + ((long)((iVar4 + 1) * id) - (long)pcVar6);
  uVar5 = (ulong)pcVar6 >> 5;
  if (this->nvisited_ <= uVar5) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0x9e);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: (n/32) < (nvisited_)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  uVar1 = this->visited_[uVar5];
  if ((uVar1 >> ((uint)pcVar6 & 0x1f) & 1) == 0) {
    this->visited_[uVar5] = uVar1 | 1 << ((byte)pcVar6 & 0x1f);
    pIVar2 = this->prog_->inst_;
    bVar3 = Try(this,id,p);
    if (bVar3) {
      if (this->longest_ != true) {
        return true;
      }
      if ((pIVar2[id].out_opcode_ & 8) != 0) {
        return true;
      }
      Visit(this,id + 1,p);
      return true;
    }
    if ((pIVar2[id].out_opcode_ & 8) == 0) {
      bVar3 = Visit(this,id + 1,p);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Backtracker::Visit(int id, const char* p) {
  // Check bitmap.  If we've already explored from here,
  // either it didn't match or it did but we're hoping for a better match.
  // Either way, don't go down that road again.
  CHECK(p <= text_.end());
  size_t n = id*(text_.size()+1) + (p - text_.begin());
  CHECK_LT(n/32, nvisited_);
  if (visited_[n/32] & (1 << (n&31)))
    return false;
  visited_[n/32] |= 1 << (n&31);

  Prog::Inst* ip = prog_->inst(id);
  if (Try(id, p)) {
    if (longest_ && !ip->last())
      Visit(id+1, p);
    return true;
  }
  if (!ip->last())
    return Visit(id+1, p);
  return false;
}